

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::on_disk_read_complete
          (torrent *this,disk_buffer_holder *buffer,storage_error *se,peer_request *r,
          shared_ptr<libtorrent::aux::torrent::read_piece_struct> *rp)

{
  element_type *peVar1;
  _func_int *p_Var2;
  error_category *peVar3;
  bool bVar4;
  undefined3 uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string_view job_name;
  undefined1 auStack_38 [20];
  int size;
  
  peVar1 = (rp->
           super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar1->blocks_left = peVar1->blocks_left + -1;
  if ((se->ec).val_ == 0) {
    memcpy((peVar1->piece_data).px + r->start,buffer->m_buf,(long)r->length);
  }
  else {
    peVar1->fail = true;
    bVar4 = (se->ec).failed_;
    uVar5 = *(undefined3 *)&(se->ec).field_0x5;
    peVar3 = (se->ec).cat_;
    (peVar1->error).val_ = (se->ec).val_;
    (peVar1->error).failed_ = bVar4;
    *(undefined3 *)&(peVar1->error).field_0x5 = uVar5;
    (peVar1->error).cat_ = peVar3;
    job_name._M_str = "read";
    job_name._M_len = 4;
    handle_disk_error(this,job_name,se,(peer_connection *)0x0,none);
  }
  if (((rp->
       super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->blocks_left == 0) {
    size = file_storage::piece_size
                     (&((this->super_torrent_hot_members).m_torrent_file.
                        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_files,(piece_index_t)(r->piece).m_val);
    p_Var2 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [5];
    if (((rp->
         super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr)->fail == true) {
      iVar6 = (*p_Var2)();
      get_handle((torrent *)auStack_38);
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code&>
                ((alert_manager *)CONCAT44(extraout_var,iVar6),(torrent_handle *)auStack_38,
                 &r->piece,
                 &((rp->
                   super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->error);
    }
    else {
      iVar6 = (*p_Var2)();
      get_handle((torrent *)auStack_38);
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::shared_array<char>&,int&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar6),(torrent_handle *)auStack_38,
                 &r->piece,
                 &((rp->
                   super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->piece_data,&size);
    }
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  }
  return;
}

Assistant:

void torrent::on_disk_read_complete(disk_buffer_holder buffer
		, storage_error const& se
		, peer_request const&  r, std::shared_ptr<read_piece_struct> rp) try
	{
		// hold a reference until this function returns
		TORRENT_ASSERT(is_single_thread());

		--rp->blocks_left;
		if (se)
		{
			rp->fail = true;
			rp->error = se.ec;
			handle_disk_error("read", se);
		}
		else
		{
			std::memcpy(rp->piece_data.get() + r.start, buffer.data(), aux::numeric_cast<std::size_t>(r.length));
		}

		if (rp->blocks_left == 0)
		{
			int size = m_torrent_file->piece_size(r.piece);
			if (rp->fail)
			{
				m_ses.alerts().emplace_alert<read_piece_alert>(
					get_handle(), r.piece, rp->error);
			}
			else
			{
				m_ses.alerts().emplace_alert<read_piece_alert>(
					get_handle(), r.piece, rp->piece_data, size);
			}
		}
	}
	catch (...) { handle_exception(); }